

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_genc.cpp
# Opt level: O3

void writeAssemblyCode(char *filename,char *destdir,char *optEntryPoint,char *optFilename,
                      char *outFilePath)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  FileStream *fileStream;
  FileStream *fileStream_00;
  size_t sVar5;
  char *pcVar6;
  char *__s;
  char *pcVar7;
  char cVar8;
  size_t sVar9;
  long lVar10;
  char cVar11;
  char *extraout_RDX;
  uint uVar12;
  uint32_t *__s_00;
  char *pcVar13;
  char *__src;
  char *in_R9;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  char *__dest;
  byte bStack_10c5;
  uint local_10c4;
  char *local_10c0;
  char entry [64];
  char local_1078;
  char local_1077 [63];
  uint32_t buffer [1024];
  
  __s_00 = (uint32_t *)0x375167;
  pcVar6 = optFilename;
  __src = outFilePath;
  fileStream = T_FileStream_open(filename,"rb");
  if (fileStream == (FileStream *)0x0) {
    writeAssemblyCode_cold_4();
LAB_001eb608:
    writeAssemblyCode_cold_3();
  }
  else {
    __src = ".S";
    pcVar6 = entry;
    getOutFilename(filename,destdir,(char *)buffer,pcVar6,".S",optFilename);
    __s_00 = (uint32_t *)0x32da7f;
    fileStream_00 = T_FileStream_open((char *)buffer,"w");
    in_R9 = optFilename;
    if (fileStream_00 == (FileStream *)0x0) goto LAB_001eb608;
    if (outFilePath != (char *)0x0) {
      strcpy(outFilePath,(char *)buffer);
    }
    if (optEntryPoint != (char *)0x0) {
      strcpy(entry,optEntryPoint);
      sVar5 = strlen(entry);
      builtin_strncpy(entry + sVar5,"_dat",5);
    }
    sVar5 = strlen(entry);
    if (sVar5 != 0) {
      sVar9 = 0;
      do {
        if ((byte)(entry[sVar9] - 0x2dU) < 2) {
          entry[sVar9] = '_';
        }
        sVar9 = sVar9 + 1;
      } while (sVar5 != sVar9);
    }
    local_10c0 = filename;
    sprintf((char *)buffer,assemblyHeader[assemblyHeaderIndex].header,entry,entry,entry,entry,entry,
            entry,entry,entry);
    T_FileStream_writeLine(fileStream_00,(char *)buffer);
    T_FileStream_writeLine(fileStream_00,assemblyHeader[assemblyHeaderIndex].beginLine);
    uVar12 = 0xffffffff;
LAB_001eb3f5:
    uVar3 = T_FileStream_read(fileStream,buffer,0x1000);
    uVar15 = (ulong)(int)uVar3;
    if (uVar3 == 0x1000) goto LAB_001eb447;
    if (uVar3 != 0) goto code_r0x001eb423;
    T_FileStream_writeLine(fileStream_00,"\n");
    __s_00 = buffer;
    pcVar6 = entry;
    __src = pcVar6;
    in_R9 = pcVar6;
    sprintf((char *)__s_00,assemblyHeader[assemblyHeaderIndex].footer,pcVar6);
    T_FileStream_writeLine(fileStream_00,(char *)__s_00);
    iVar4 = T_FileStream_error(fileStream);
    if (iVar4 == 0) {
      iVar4 = T_FileStream_error(fileStream_00);
      if (iVar4 == 0) {
        T_FileStream_close(fileStream_00);
        T_FileStream_close(fileStream);
        return;
      }
      goto LAB_001eb61f;
    }
  }
  writeAssemblyCode_cold_1();
LAB_001eb61f:
  pcVar13 = local_10c0;
  writeAssemblyCode_cold_2();
  __s = findBasename(pcVar13);
  pcVar7 = strrchr(__s,0x2e);
  pcVar16 = __s;
  if ((__s_00 == (uint32_t *)0x0) ||
     (__dest = extraout_RDX, cVar11 = (char)*__s_00, (char)*__s_00 == '\0')) {
    pcVar16 = pcVar13;
    __dest = extraout_RDX;
    if (pcVar13 < __s) {
      do {
        cVar11 = *pcVar13;
        pcVar13 = pcVar13 + 1;
        *__dest = cVar11;
        __dest = __dest + 1;
        pcVar16 = __s;
      } while (pcVar13 != __s);
    }
  }
  else {
    do {
      cVar8 = cVar11;
      pcVar13 = __dest;
      __s_00 = (uint32_t *)((long)__s_00 + 1);
      *pcVar13 = cVar8;
      __dest = pcVar13 + 1;
      cVar11 = *(char *)__s_00;
    } while (*(char *)__s_00 != '\0');
    if (cVar8 != '/') {
      *__dest = '/';
      __dest = pcVar13 + 2;
    }
  }
  if (pcVar7 == (char *)0x0) {
    strcpy(pcVar6,pcVar16);
    if (in_R9 == (char *)0x0) {
      in_R9 = pcVar16;
    }
  }
  else {
    pcVar13 = __dest;
    if (pcVar16 < pcVar7) {
      lVar14 = (long)pcVar7 - (long)pcVar16;
      do {
        cVar11 = *pcVar16;
        if (*pcVar16 == '-') {
          cVar11 = '_';
        }
        *pcVar6 = cVar11;
        *pcVar13 = cVar11;
        pcVar16 = pcVar16 + 1;
        pcVar13 = pcVar13 + 1;
        pcVar6 = pcVar6 + 1;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    *pcVar6 = '_';
    *pcVar13 = '_';
    pcVar13 = pcVar13 + 1;
    pcVar6 = pcVar6 + 1;
    cVar11 = pcVar16[1];
    if (cVar11 != '\0') {
      pcVar16 = pcVar16 + 2;
      do {
        *pcVar6 = cVar11;
        *pcVar13 = cVar11;
        pcVar13 = pcVar13 + 1;
        pcVar6 = pcVar6 + 1;
        cVar11 = *pcVar16;
        pcVar16 = pcVar16 + 1;
      } while (cVar11 != '\0');
    }
    *pcVar6 = '\0';
    if (in_R9 == (char *)0x0) {
      strcpy(pcVar13,__src);
      return;
    }
  }
  strcpy(__dest,in_R9);
  strcat(__dest,__src);
  return;
code_r0x001eb423:
  if ((uVar15 & 3) != 0) {
    memset(buffer + uVar15,0,(ulong)(uint)((int)(uVar15 & 3) << 2));
  }
  if (3 < uVar3) {
LAB_001eb447:
    lVar14 = 0;
    do {
      uVar3 = buffer[lVar14];
      local_10c4 = uVar3;
      if (uVar12 == 0xffffffff) {
        pcVar6 = &local_1078;
LAB_001eb4b9:
        uVar12 = 1;
      }
      else {
        if (0x1f < uVar12) {
          local_1078 = '\n';
          strcpy(local_1077,assemblyHeader[assemblyHeaderIndex].beginLine);
          sVar5 = strlen(local_1077);
          pcVar6 = local_1077 + sVar5;
          goto LAB_001eb4b9;
        }
        local_1078 = ',';
        uVar12 = uVar12 + 1;
        pcVar6 = local_1077;
      }
      if (uVar3 < 10) {
        *pcVar6 = write32(_FileStream*,unsigned_int,unsigned_int)::hexToStr[uVar3];
        pcVar6 = pcVar6 + 1;
      }
      else {
        if (hexType == 1) {
          *pcVar6 = '0';
          pcVar6 = pcVar6 + 1;
        }
        else if (hexType == 0) {
          pcVar6[0] = '0';
          pcVar6[1] = 'x';
          pcVar6 = pcVar6 + 2;
        }
        bVar2 = false;
        lVar10 = 4;
        do {
          bVar1 = (&bStack_10c5)[lVar10];
          if ((bVar2) || (bVar1 != 0)) {
            *pcVar6 = write32(_FileStream*,unsigned_int,unsigned_int)::hexToStr[bVar1 >> 4];
            pcVar6[1] = write32(_FileStream*,unsigned_int,unsigned_int)::hexToStr[bVar1 & 0xf];
            pcVar6 = pcVar6 + 2;
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
        if (hexType == 1) {
          *pcVar6 = 'h';
          pcVar6 = pcVar6 + 1;
        }
      }
      *pcVar6 = '\0';
      T_FileStream_writeLine(fileStream_00,&local_1078);
      lVar14 = lVar14 + 1;
    } while (lVar14 != (uVar15 >> 2) + (ulong)(uVar15 >> 2 == 0));
  }
  goto LAB_001eb3f5;
}

Assistant:

U_CAPI void U_EXPORT2
writeAssemblyCode(const char *filename, const char *destdir, const char *optEntryPoint, const char *optFilename, char *outFilePath) {
    uint32_t column = MAX_COLUMN;
    char entry[64];
    uint32_t buffer[1024];
    char *bufferStr = (char *)buffer;
    FileStream *in, *out;
    size_t i, length;

    in=T_FileStream_open(filename, "rb");
    if(in==NULL) {
        fprintf(stderr, "genccode: unable to open input file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    getOutFilename(filename, destdir, bufferStr, entry, ".S", optFilename);
    out=T_FileStream_open(bufferStr, "w");
    if(out==NULL) {
        fprintf(stderr, "genccode: unable to open output file %s\n", bufferStr);
        exit(U_FILE_ACCESS_ERROR);
    }

    if (outFilePath != NULL) {
        uprv_strcpy(outFilePath, bufferStr);
    }

#if defined (WINDOWS_WITH_GNUC) && U_PLATFORM != U_PF_CYGWIN
    /* Need to fix the file separator character when using MinGW. */
    swapFileSepChar(outFilePath, U_FILE_SEP_CHAR, '/');
#endif

    if(optEntryPoint != NULL) {
        uprv_strcpy(entry, optEntryPoint);
        uprv_strcat(entry, "_dat");
    }

    /* turn dashes or dots in the entry name into underscores */
    length=uprv_strlen(entry);
    for(i=0; i<length; ++i) {
        if(entry[i]=='-' || entry[i]=='.') {
            entry[i]='_';
        }
    }

    sprintf(bufferStr, assemblyHeader[assemblyHeaderIndex].header,
        entry, entry, entry, entry,
        entry, entry, entry, entry);
    T_FileStream_writeLine(out, bufferStr);
    T_FileStream_writeLine(out, assemblyHeader[assemblyHeaderIndex].beginLine);

    for(;;) {
        length=T_FileStream_read(in, buffer, sizeof(buffer));
        if(length==0) {
            break;
        }
        if (length != sizeof(buffer)) {
            /* pad with extra 0's when at the end of the file */
            for(i=0; i < (length % sizeof(uint32_t)); ++i) {
                buffer[length+i] = 0;
            }
        }
        for(i=0; i<(length/sizeof(buffer[0])); i++) {
            column = write32(out, buffer[i], column);
        }
    }

    T_FileStream_writeLine(out, "\n");

    sprintf(bufferStr, assemblyHeader[assemblyHeaderIndex].footer,
        entry, entry, entry, entry,
        entry, entry, entry, entry);
    T_FileStream_writeLine(out, bufferStr);

    if(T_FileStream_error(in)) {
        fprintf(stderr, "genccode: file read error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    if(T_FileStream_error(out)) {
        fprintf(stderr, "genccode: file write error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    T_FileStream_close(out);
    T_FileStream_close(in);
}